

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

int ffchfl(fitsfile *fptr,int *status)

{
  long bytepos;
  long lVar1;
  bool bVar2;
  int iVar3;
  FITSfile *pFVar4;
  int iVar5;
  char *err_message;
  int iVar6;
  char rec [81];
  
  if (0 < *status) {
    return *status;
  }
  pFVar4 = fptr->Fptr;
  if (fptr->HDUposition != pFVar4->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    pFVar4 = fptr->Fptr;
  }
  bytepos = pFVar4->headend;
  lVar1 = pFVar4->datastart;
  ffmbyt(fptr,bytepos,1,status);
  bVar2 = false;
  iVar6 = (int)((lVar1 - bytepos) / 0x50);
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  iVar6 = iVar6 + 1;
  do {
    iVar6 = iVar6 + -1;
    if (iVar6 == 0) goto LAB_001372ea;
    ffgbyt(fptr,0x50,rec,status);
    if (rec._0_8_ == 0x2020202020444e45) {
      if (bVar2) {
        *status = 0xfe;
        ffpmsg("Warning: Header fill area contains duplicate END card:");
      }
      iVar3 = bcmp(rec + 8,
                   "                                                                        ",0x48);
      iVar5 = 0xfd;
      err_message = "Warning: END keyword contains extraneous non-blank characters:";
LAB_001372c0:
      bVar2 = true;
      if (iVar3 != 0) {
        *status = iVar5;
        ffpmsg(err_message);
      }
    }
    else {
      if (bVar2) {
        iVar3 = bcmp(rec,
                     "                                                                                "
                     ,0x50);
        iVar5 = 0xfe;
        err_message = "Warning: Header fill area contains extraneous non-blank characters:";
        goto LAB_001372c0;
      }
      bVar2 = false;
    }
  } while (*status < 1);
  rec[0x50] = '\0';
  ffpmsg(rec);
LAB_001372ea:
  return *status;
}

Assistant:

int ffchfl( fitsfile *fptr, int *status)
{
   int nblank,i,gotend;
   LONGLONG endpos;
   char rec[FLEN_CARD];
   char *blanks="                                                                                ";  /*  80 spaces  */

   if( *status > 0 ) return (*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

   /*   calculate the number of blank keyword slots in the header  */

   endpos=(fptr->Fptr)->headend;
   nblank=(long) (((fptr->Fptr)->datastart-endpos)/80);

   /*   move the i/o pointer to the end of the header keywords   */

   ffmbyt(fptr,endpos,TRUE,status);

   /*   find the END card (there may be blank keywords perceeding it)   */

   gotend=FALSE;
   for(i=0;i<nblank;i++) {
      ffgbyt(fptr,80,rec,status);
      if( !strncmp(rec, "END     ", 8) ) {
         if( gotend ) {
            /*   There is a duplicate END record   */
            *status=BAD_HEADER_FILL;
            ffpmsg("Warning: Header fill area contains duplicate END card:");
         }
         gotend=TRUE;
         if( strncmp( rec+8, blanks+8, 72) ) {
            /*   END keyword has extra characters   */
            *status=END_JUNK;
            ffpmsg(
            "Warning: END keyword contains extraneous non-blank characters:");
         }
      } else if( gotend ) {
         if( strncmp( rec, blanks, 80 ) ) {
            /*   The fill area contains extraneous characters   */
            *status=BAD_HEADER_FILL;
            ffpmsg(
         "Warning: Header fill area contains extraneous non-blank characters:");
         }
      }

      if( *status > 0 ) {
         rec[FLEN_CARD - 1] = '\0';  /* make sure string is null terminated */
         ffpmsg(rec);
         return( *status );
      }
   }
   return( *status );
}